

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O1

void __thiscall de::BlockBufferBasicTest::Producer::run(Producer *this)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  deBool dVar4;
  size_t in_RCX;
  int iVar5;
  long lVar6;
  int iVar7;
  Random rnd;
  Message tmpBuf [64];
  deRandom dStack_148;
  uint local_138 [66];
  
  deSleep(1);
  deRandom_init(&dStack_148,(uint)this->m_threadId);
  iVar7 = 0;
  memset(local_138,0,0x100);
  iVar5 = this->m_numMessages;
  if (0 < iVar5) {
    do {
      uVar2 = iVar5 - iVar7;
      if (0x3f < iVar5 - iVar7) {
        uVar2 = 0x40;
      }
      dVar3 = deRandom_getUint32(&dStack_148);
      iVar5 = dVar3 % uVar2 + 1;
      if (dVar3 % uVar2 < 0x7fffffff) {
        iVar1 = *(int *)&this->m_threadId;
        in_RCX = (size_t)iVar5;
        lVar6 = 0;
        do {
          local_138[lVar6] = iVar7 + (int)lVar6 & 0xffffU | iVar1 << 0x10;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (long)in_RCX);
        iVar7 = iVar7 + (int)lVar6;
      }
      BlockBuffer<de::BlockBufferBasicTest::Message>::write(this->m_buffer,iVar5,local_138,in_RCX);
      dVar4 = deRandom_getBool(&dStack_148);
      if (dVar4 == 1) {
        BlockBuffer<de::BlockBufferBasicTest::Message>::flush(this->m_buffer);
      }
      iVar5 = this->m_numMessages;
    } while (iVar7 < iVar5);
  }
  return;
}

Assistant:

void run (void)
	{
		// Yield to give main thread chance to start other producers.
		deSleep(1);

		Random	rnd		(m_threadId);
		int		msgNdx	= 0;
		Message	tmpBuf[64];

		while (msgNdx < m_numMessages)
		{
			int writeSize = rnd.getInt(1, de::min(m_numMessages-msgNdx, DE_LENGTH_OF_ARRAY(tmpBuf)));
			for (int ndx = 0; ndx < writeSize; ndx++)
				tmpBuf[ndx] = Message(m_threadId, (deUint16)msgNdx++);

			m_buffer.write(writeSize, &tmpBuf[0]);
			if (rnd.getBool())
				m_buffer.flush();
		}
	}